

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents::
TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents
          (TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents *this)

{
  char *suiteName;
  TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents *this_local;
  
  suiteName = UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"CheckCloseFailureBecauseOfExceptionIncludesCheckContents",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/UnitTest++/src/tests/TestCheckMacros.cpp"
             ,0x126);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents_001830c0;
  return;
}

Assistant:

TEST(CheckCloseFailureBecauseOfExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "(float)ThrowingFunction()"));
    CHECK(strstr(reporter.lastFailedMessage, "1.0001f"));
}